

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

LineParametersWithConfidence *
deqp::gles3::Performance::anon_unknown_1::
fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          (LineParametersWithConfidence *__return_storage_ptr__,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
          *samples,int beginNdx,int endNdx,int step,
          offset_in_MapBufferRangeDurationNoAlloc_to_deUint64 target)

{
  int iVar1;
  const_reference pvVar2;
  float *pfVar3;
  float local_74;
  Vector<float,_2> local_4c;
  Vec2 point;
  int sampleNdx;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePoints;
  offset_in_MapBufferRangeDurationNoAlloc_to_deUint64 target_local;
  int step_local;
  int endNdx_local;
  int beginNdx_local;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  *samples_local;
  
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             (point.m_data + 1));
  for (point.m_data[0] = (float)beginNdx; (int)point.m_data[0] < endNdx;
      point.m_data[0] = (float)(step + (int)point.m_data[0])) {
    tcu::Vector<float,_2>::Vector(&local_4c);
    pvVar2 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
             ::operator[](samples,(long)(int)point.m_data[0]);
    iVar1 = pvVar2->writtenSize;
    pfVar3 = tcu::Vector<float,_2>::x(&local_4c);
    *pfVar3 = (float)iVar1;
    pvVar2 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
             ::operator[](samples,(long)(int)point.m_data[0]);
    local_74 = (float)*(ulong *)((long)&(pvVar2->duration).mapDuration + target);
    pfVar3 = tcu::Vector<float,_2>::y(&local_4c);
    *pfVar3 = local_74;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               (point.m_data + 1),&local_4c);
  }
  deqp::gls::theilSenSiegelLinearRegression
            (__return_storage_ptr__,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             (point.m_data + 1),0.6);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             (point.m_data + 1));
  return __return_storage_ptr__;
}

Assistant:

static LineParametersWithConfidence fitLineToSamples (const std::vector<UploadSampleResult<DurationType> >& samples, int beginNdx, int endNdx, int step, deUint64 DurationType::*target = &DurationType::fitResponseDuration)
{
	std::vector<tcu::Vec2> samplePoints;

	for (int sampleNdx = beginNdx; sampleNdx < endNdx; sampleNdx += step)
	{
		tcu::Vec2 point;

		point.x() = (float)(samples[sampleNdx].writtenSize);
		point.y() = (float)(samples[sampleNdx].duration.*target);

		samplePoints.push_back(point);
	}

	return theilSenSiegelLinearRegression(samplePoints, 0.6f);
}